

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.h
# Opt level: O0

void __thiscall
BloomFilter<long_long>::BloomFilter(BloomFilter<long_long> *this,size_t m,size_t n,int seed,int k)

{
  size_t __n;
  value_type local_78;
  int local_68;
  int i;
  allocator<bool> local_51;
  vector<bool,_std::allocator<bool>_> local_50;
  int local_28;
  int local_24;
  int k_local;
  int seed_local;
  size_t n_local;
  size_t m_local;
  BloomFilter<long_long> *this_local;
  
  this->_vptr_BloomFilter = (_func_int **)&PTR__BloomFilter_00130d20;
  local_28 = k;
  local_24 = seed;
  _k_local = n;
  n_local = m;
  m_local = (size_t)this;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->_bits);
  std::
  vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
  ::vector(&this->_hashes);
  __n = n_local;
  this->_max = _k_local;
  this->_length = n_local;
  this->_seed = local_24;
  std::allocator<bool>::allocator(&local_51);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_50,__n,&local_51);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->_bits,&local_50);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_50);
  std::allocator<bool>::~allocator(&local_51);
  for (local_68 = 0; local_68 < local_28; local_68 = local_68 + 1) {
    std::
    bind<unsigned_long(&)(void_const*,int,unsigned_int),std::_Placeholder<1>const&,std::_Placeholder<2>const&,int>
              ((_func_unsigned_long_void_ptr_int_uint *)&local_78,(_Placeholder<1> *)MurmurHash64A,
               (_Placeholder<2> *)&std::placeholders::_1,(int *)&std::placeholders::_2);
    std::
    vector<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
    ::push_back(&this->_hashes,&local_78);
  }
  return;
}

Assistant:

BloomFilter<T>::BloomFilter(size_t m, size_t n, int seed, int k) :_length(m), _max(n), _seed(seed) {
    _bits = vector<bool>(m);
    for (int i = 0; i < k; i++) {
        _hashes.push_back(std::bind(MurmurHash64A, _1, _2, seed + i));
    }
}